

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O2

string * ZXing::OneD::DecodeCode39AndCode93FullASCII
                   (string *__return_storage_ptr__,string *encoded,char *ctrl)

{
  byte bVar1;
  bool bVar2;
  byte c;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar3 = (byte *)(encoded->_M_dataplus)._M_p;
  pbVar4 = pbVar3;
  pbVar5 = pbVar3;
  do {
    if (pbVar4 == pbVar3 + encoded->_M_string_length) {
      std::__cxx11::string::erase(encoded,pbVar5);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)encoded);
      return __return_storage_ptr__;
    }
    c = *pbVar4;
    bVar2 = Contains(ctrl,c);
    if (bVar2) {
      bVar1 = pbVar4[1];
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      pbVar4 = pbVar4 + 1;
      if (c == *ctrl) {
        c = bVar1 - 0x40;
      }
      else if (c == ctrl[1]) {
        c = PERCENTAGE_MAPPING[(byte)(bVar1 + 0xbf)];
      }
      else if (c == ctrl[2]) {
        c = bVar1 - 0x20;
      }
      else {
        c = bVar1 | 0x20;
      }
    }
    *pbVar5 = c;
    pbVar5 = pbVar5 + 1;
    pbVar4 = pbVar4 + 1;
    pbVar3 = (byte *)(encoded->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

std::string DecodeCode39AndCode93FullASCII(std::string encoded, const char ctrl[4])
{
	auto out = encoded.begin();
	for (auto in = encoded.cbegin(); in != encoded.cend(); ++in) {
		char c = *in;
		if (Contains(ctrl, c)) {
			char next = *++in; // if in is one short of cend(), then next == 0
			if (next < 'A' || next > 'Z')
				return {};
			if (c == ctrl[0])
				c = next - 64; // $A to $Z map to control codes SH to SB
			else if (c == ctrl[1])
				c = PERCENTAGE_MAPPING[next - 'A'];
			else if (c == ctrl[2])
				c = next - 32; // /A to /O map to ! to , and /Z maps to :
			else
				c = next + 32; // +A to +Z map to a to z
		}
		*out++ = c;
	}
	encoded.erase(out, encoded.end());
	return encoded;
}